

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O1

void __thiscall
AstWalker::visitFunctionInvocationExpressionAstNode
          (AstWalker *this,FunctionInvocationExpressionAstNode *node)

{
  pointer psVar1;
  shared_ptr<ExpressionAstNode> *expression;
  pointer psVar2;
  
  (*this->_vptr_AstWalker[0x1d])();
  psVar1 = (node->expressions).
           super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (node->expressions).
                super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    (*this->_vptr_AstWalker[3])
              (this,(psVar2->super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
  }
  (*this->_vptr_AstWalker[0x2c])(this,node);
  return;
}

Assistant:

void AstWalker::visitFunctionInvocationExpressionAstNode(FunctionInvocationExpressionAstNode* node) noexcept {
  this->onEnterFunctionInvocationExpressionAstNode(node);
  for (auto& expression : node->expressions) {
    this->visitExpressionAstNode(expression.get());
  }
  this->onExitFunctionInvocationExpressionAstNode(node);
}